

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_field.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::cpp::anon_unknown_3::SingularString::GenerateOneofCopyConstruct
          (SingularString *this,Printer *p)

{
  undefined8 uVar1;
  char *pcVar2;
  
  if (((this->super_FieldGeneratorBase).is_inlined_ == false) &&
     (*(long *)(*(long *)((this->super_FieldGeneratorBase).field_ + 0x50) + 8) != 0)) {
    pcVar2 = "new (&$field$) decltype($field$){arena, from.$field$, $default_variable_field$};\n";
    uVar1 = 0x51;
  }
  else {
    pcVar2 = "new (&$field$) decltype($field$){arena, from.$field$};\n";
    uVar1 = 0x37;
  }
  google::protobuf::io::Printer::Emit(p,0,0,uVar1,pcVar2);
  return;
}

Assistant:

void GenerateOneofCopyConstruct(io::Printer* p) const override {
    if (is_inlined() || EmptyDefault()) {
      p->Emit("new (&$field$) decltype($field$){arena, from.$field$};\n");
    } else {
      p->Emit(
          "new (&$field$) decltype($field$){arena, from.$field$,"
          " $default_variable_field$};\n");
    }
  }